

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_Linux_util.cpp
# Opt level: O0

void __kmp_resume_template<kmp_flag_32>(int target_gtid,kmp_flag_32 *flag)

{
  bool bVar1;
  flag_type fVar2;
  flag_type fVar3;
  uint old_loc;
  kmp_basic_flag<unsigned_int> *in_RSI;
  int in_EDI;
  flag_t old_spin;
  int status;
  kmp_info_t *th;
  undefined8 in_stack_fffffffffffffe20;
  int code;
  undefined1 local_160 [24];
  kmp_msg_t local_148 [2];
  undefined1 local_118 [8];
  kmp_info_t *in_stack_fffffffffffffef0;
  undefined1 local_80 [24];
  kmp_msg_t local_68 [2];
  undefined1 local_38 [28];
  int local_1c;
  kmp_info_t *local_18;
  kmp_basic_flag<unsigned_int> *local_10;
  
  code = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_18 = __kmp_threads[in_EDI];
  local_10 = in_RSI;
  __kmp_suspend_initialize_thread(in_stack_fffffffffffffef0);
  local_1c = pthread_mutex_lock((pthread_mutex_t *)&(local_18->th).th_suspend_mx);
  if (local_1c != 0) {
    __kmp_msg_format((uint)local_38,0x400b2,"pthread_mutex_lock");
    __kmp_msg_error_code(code);
    local_68[0].type = __kmp_msg_null.type;
    local_68[0].num = __kmp_msg_null.num;
    local_68[0].str = __kmp_msg_null.str;
    local_68[0].len = __kmp_msg_null.len;
    local_68[0]._20_4_ = __kmp_msg_null._20_4_;
    __kmp_fatal();
  }
  if (local_10 == (kmp_basic_flag<unsigned_int> *)0x0) {
    local_10 = (kmp_basic_flag<unsigned_int> *)(local_18->th).th_sleep_loc;
  }
  if (local_10 != (kmp_basic_flag<unsigned_int> *)0x0) {
    fVar2 = kmp_flag<unsigned_int>::get_type(&local_10->super_kmp_flag<unsigned_int>);
    fVar3 = kmp_flag_32::get_ptr_type((kmp_flag_32 *)local_10);
    if (fVar2 == fVar3) {
      old_loc = kmp_basic_flag<unsigned_int>::unset_sleeping
                          ((kmp_basic_flag<unsigned_int> *)0x19f278);
      bVar1 = kmp_basic_flag<unsigned_int>::is_sleeping_val(local_10,old_loc);
      if (!bVar1) {
        local_1c = pthread_mutex_unlock((pthread_mutex_t *)&(local_18->th).th_suspend_mx);
        if (local_1c == 0) {
          return;
        }
        __kmp_msg_format((uint)&stack0xffffffffffffff30,0x400b2,"pthread_mutex_unlock");
        __kmp_msg_error_code(code);
        __kmp_fatal();
      }
      (local_18->th).th_sleep_loc = (void *)0x0;
      local_1c = pthread_cond_signal((pthread_cond_t *)&(local_18->th).th_suspend_cv);
      if (local_1c != 0) {
        __kmp_msg_format((uint)local_118,0x400b2,"pthread_cond_signal");
        __kmp_msg_error_code(code);
        local_148[0].type = __kmp_msg_null.type;
        local_148[0].num = __kmp_msg_null.num;
        local_148[0].str = __kmp_msg_null.str;
        local_148[0].len = __kmp_msg_null.len;
        local_148[0]._20_4_ = __kmp_msg_null._20_4_;
        __kmp_fatal();
      }
      local_1c = pthread_mutex_unlock((pthread_mutex_t *)&(local_18->th).th_suspend_mx);
      if (local_1c == 0) {
        return;
      }
      __kmp_msg_format((uint)local_160,0x400b2,"pthread_mutex_unlock");
      __kmp_msg_error_code(code);
      __kmp_fatal();
    }
  }
  local_1c = pthread_mutex_unlock((pthread_mutex_t *)&(local_18->th).th_suspend_mx);
  if (local_1c == 0) {
    return;
  }
  __kmp_msg_format((uint)local_80,0x400b2,"pthread_mutex_unlock");
  __kmp_msg_error_code(code);
  __kmp_fatal();
}

Assistant:

static inline void __kmp_resume_template(int target_gtid, C *flag) {
  KMP_TIME_DEVELOPER_PARTITIONED_BLOCK(USER_resume);
  kmp_info_t *th = __kmp_threads[target_gtid];
  int status;

#ifdef KMP_DEBUG
  int gtid = TCR_4(__kmp_init_gtid) ? __kmp_get_gtid() : -1;
#endif

  KF_TRACE(30, ("__kmp_resume_template: T#%d wants to wakeup T#%d enter\n",
                gtid, target_gtid));
  KMP_DEBUG_ASSERT(gtid != target_gtid);

  __kmp_suspend_initialize_thread(th);

  status = pthread_mutex_lock(&th->th.th_suspend_mx.m_mutex);
  KMP_CHECK_SYSFAIL("pthread_mutex_lock", status);

  if (!flag) { // coming from __kmp_null_resume_wrapper
    flag = (C *)CCAST(void *, th->th.th_sleep_loc);
  }

  // First, check if the flag is null or its type has changed. If so, someone
  // else woke it up.
  if (!flag || flag->get_type() != flag->get_ptr_type()) { // get_ptr_type
    // simply shows what
    // flag was cast to
    KF_TRACE(5, ("__kmp_resume_template: T#%d exiting, thread T#%d already "
                 "awake: flag(%p)\n",
                 gtid, target_gtid, NULL));
    status = pthread_mutex_unlock(&th->th.th_suspend_mx.m_mutex);
    KMP_CHECK_SYSFAIL("pthread_mutex_unlock", status);
    return;
  } else { // if multiple threads are sleeping, flag should be internally
    // referring to a specific thread here
    typename C::flag_t old_spin = flag->unset_sleeping();
    if (!flag->is_sleeping_val(old_spin)) {
      KF_TRACE(5, ("__kmp_resume_template: T#%d exiting, thread T#%d already "
                   "awake: flag(%p): "
                   "%u => %u\n",
                   gtid, target_gtid, flag->get(), old_spin, *flag->get()));
      status = pthread_mutex_unlock(&th->th.th_suspend_mx.m_mutex);
      KMP_CHECK_SYSFAIL("pthread_mutex_unlock", status);
      return;
    }
    KF_TRACE(5, ("__kmp_resume_template: T#%d about to wakeup T#%d, reset "
                 "sleep bit for flag's loc(%p): "
                 "%u => %u\n",
                 gtid, target_gtid, flag->get(), old_spin, *flag->get()));
  }
  TCW_PTR(th->th.th_sleep_loc, NULL);

#ifdef DEBUG_SUSPEND
  {
    char buffer[128];
    __kmp_print_cond(buffer, &th->th.th_suspend_cv);
    __kmp_printf("__kmp_resume_template: T#%d resuming T#%d: %s\n", gtid,
                 target_gtid, buffer);
  }
#endif
  status = pthread_cond_signal(&th->th.th_suspend_cv.c_cond);
  KMP_CHECK_SYSFAIL("pthread_cond_signal", status);
  status = pthread_mutex_unlock(&th->th.th_suspend_mx.m_mutex);
  KMP_CHECK_SYSFAIL("pthread_mutex_unlock", status);
  KF_TRACE(30, ("__kmp_resume_template: T#%d exiting after signaling wake up"
                " for T#%d\n",
                gtid, target_gtid));
}